

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QList<int> * __thiscall QAccessibleTable::selectedColumns(QAccessibleTable *this)

{
  bool bVar1;
  QItemSelectionModel *pQVar2;
  const_iterator o;
  QModelIndex *this_00;
  QList<int> *in_RSI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  QList<int> *columns;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList selectedColumns;
  QAbstractItemView *this_01;
  const_iterator local_28;
  QList<QModelIndex> local_20;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  view((QAccessibleTable *)0x7f3a1b);
  pQVar2 = QAbstractItemView::selectionModel(this_01);
  if (pQVar2 == (QItemSelectionModel *)0x0) {
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x7f3a42);
  }
  else {
    *(undefined1 **)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
         &DAT_aaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x7f3a75);
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    view((QAccessibleTable *)0x7f3aa3);
    QAbstractItemView::selectionModel(this_01);
    QItemSelectionModel::selectedColumns((int)&local_20);
    QList<QModelIndex>::size(&local_20);
    QList<int>::reserve(in_RSI,asize);
    local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QModelIndex>::begin((QList<QModelIndex> *)this_01);
    o = QList<QModelIndex>::end((QList<QModelIndex> *)this_01);
    while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_28,o), bVar1) {
      this_00 = QList<QModelIndex>::const_iterator::operator*(&local_28);
      QModelIndex::column(this_00);
      QList<int>::append((QList<int> *)0x7f3b71,(parameter_type)((ulong)in_RDI >> 0x20));
      QList<QModelIndex>::const_iterator::operator++(&local_28);
    }
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7f3b8c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return (QList<int> *)this_01;
}

Assistant:

QList<int> QAccessibleTable::selectedColumns() const
{
    if (!view()->selectionModel())
        return QList<int>();
    QList<int> columns;
    const QModelIndexList selectedColumns = view()->selectionModel()->selectedColumns();
    columns.reserve(selectedColumns.size());
    for (const QModelIndex &index : selectedColumns)
        columns.append(index.column());

    return columns;
}